

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageNextXrGetViewConfigurationProperties
                   (XrInstance instance,XrSystemId systemId,
                   XrViewConfigurationType viewConfigurationType,
                   XrViewConfigurationProperties *configurationProperties)

{
  XrResult XVar1;
  GenValidUsageXrInstanceInfo *pGVar2;
  
  pGVar2 = HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>::get
                     (&g_instance_info.
                       super_HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>,instance);
  XVar1 = (*pGVar2->dispatch_table->GetViewConfigurationProperties)
                    (instance,systemId,viewConfigurationType,configurationProperties);
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrGetViewConfigurationProperties(
    XrInstance instance,
    XrSystemId systemId,
    XrViewConfigurationType viewConfigurationType,
    XrViewConfigurationProperties* configurationProperties) {
    XrResult result = XR_SUCCESS;
    try {
        GenValidUsageXrInstanceInfo *gen_instance_info = g_instance_info.get(instance);
        result = gen_instance_info->dispatch_table->GetViewConfigurationProperties(instance, systemId, viewConfigurationType, configurationProperties);
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}